

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall soplex::SSVectorBase<double>::clear(SSVectorBase<double> *this)

{
  int *piVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  
  if (this->setupStatus == true) {
    lVar4 = (long)(this->super_IdxSet).num;
    if (0 < lVar4) {
      piVar1 = (this->super_IdxSet).idx;
      pdVar2 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar5 = 0;
      do {
        pdVar2[piVar1[lVar5]] = 0.0;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  else {
    pdVar2 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pdVar2 != pdVar3) {
      memset(pdVar2,0,(long)pdVar3 - (long)pdVar2 & 0xfffffffffffffff8);
    }
  }
  (this->super_IdxSet).num = 0;
  this->setupStatus = true;
  return;
}

Assistant:

void clear()
   {
      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            VectorBase<R>::val[idx[i]] = 0;
      }
      else
         VectorBase<R>::clear();

      IdxSet::clear();
      setupStatus = true;

      assert(isConsistent());
   }